

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O1

char * Wln_ObjName(Wln_Ntk_t *p,int iObj)

{
  uint uVar1;
  int NameId;
  char *pcVar2;
  
  uVar1 = (p->vNameIds).nSize;
  if (0 < (int)uVar1) {
    if (uVar1 <= (uint)iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    NameId = (p->vNameIds).pArray[(uint)iObj];
    if (NameId != 0) {
      pcVar2 = Abc_NamStr(p->pManName,NameId);
      return pcVar2;
    }
  }
  sprintf(Wln_ObjName::Buffer,"n%d");
  return Wln_ObjName::Buffer;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creating objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Wln_ObjName( Wln_Ntk_t * p, int iObj )
{
    static char Buffer[100];
    if ( Wln_NtkHasNameId(p) && Wln_ObjNameId(p, iObj) )
        return Abc_NamStr( p->pManName, Wln_ObjNameId(p, iObj) );
    sprintf( Buffer, "n%d", iObj );
    return Buffer;
}